

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall kj::Exception::wrapContext(Exception *this,char *file,int line,String *description)

{
  Context *pCVar1;
  Context *pCVar2;
  
  pCVar2 = (Context *)operator_new(0x38);
  pCVar2->file = file;
  pCVar2->line = line;
  (pCVar2->description).content.ptr = (description->content).ptr;
  (pCVar2->description).content.size_ = (description->content).size_;
  (pCVar2->description).content.disposer = (description->content).disposer;
  (description->content).ptr = (char *)0x0;
  (description->content).size_ = 0;
  pCVar1 = (this->context).ptr.ptr;
  (pCVar2->next).ptr.disposer = (this->context).ptr.disposer;
  (pCVar2->next).ptr.ptr = pCVar1;
  (this->context).ptr.disposer = (Disposer *)&_::HeapDisposer<kj::Exception::Context>::instance;
  (this->context).ptr.ptr = pCVar2;
  return;
}

Assistant:

void Exception::wrapContext(const char* file, int line, String&& description) {
  context = heap<Context>(file, line, mv(description), mv(context));
}